

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O0

ebml_element *
EBML_ElementSkipData
          (ebml_element *p,stream *Input,ebml_parser_context *Context,ebml_element *TestReadElt,
          bool_t AllowDummyElt)

{
  code *pcVar1;
  ebml_parser_context *peVar2;
  bool_t bVar3;
  filepos_t fVar4;
  int local_3c;
  ebml_element *peStack_38;
  int bUpperElement;
  ebml_element *Result;
  bool_t AllowDummyElt_local;
  ebml_element *TestReadElt_local;
  ebml_parser_context *Context_local;
  stream *Input_local;
  ebml_element *p_local;
  
  peStack_38 = (ebml_element *)0x0;
  Result = (ebml_element *)AllowDummyElt;
  AllowDummyElt_local = (bool_t)TestReadElt;
  TestReadElt_local = (ebml_element *)Context;
  Context_local = (ebml_parser_context *)Input;
  Input_local = (stream *)p;
  bVar3 = EBML_ElementIsFiniteSize(p);
  peVar2 = Context_local;
  if (bVar3 == 0) {
    local_3c = 0;
    peStack_38 = EBML_FindNextElement
                           ((stream *)Context_local,(ebml_parser_context *)TestReadElt_local,
                            &local_3c,(bool_t)Result);
    peVar2 = Context_local;
    if (peStack_38 != (ebml_element *)0x0) {
      if (Context_local == (ebml_parser_context *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                      ,0x69,
                      "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                     );
      }
      pcVar1 = *(code **)&Context_local->UpContext[3].Profile;
      fVar4 = EBML_ElementPositionData(peStack_38);
      (*pcVar1)(peVar2,fVar4,0);
    }
  }
  else {
    if (AllowDummyElt_local != 0) {
      __assert_fail("TestReadElt == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x61,
                    "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                   );
    }
    if (*(long *)(Input_local->URL + 0x28) <= *(long *)(Input_local->URL + 0x20)) {
      __assert_fail("p->ElementPosition < p->SizePosition",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x62,
                    "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                   );
    }
    if (Context_local == (ebml_parser_context *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,99,
                    "ebml_element *EBML_ElementSkipData(ebml_element *, struct stream *, const ebml_parser_context *, ebml_element *, bool_t)"
                   );
    }
    pcVar1 = *(code **)&Context_local->UpContext[3].Profile;
    fVar4 = EBML_ElementPositionEnd((ebml_element *)Input_local);
    (*pcVar1)(peVar2,fVar4,0);
  }
  return peStack_38;
}

Assistant:

ebml_element *EBML_ElementSkipData(ebml_element *p, struct stream *Input, const ebml_parser_context *Context, ebml_element *TestReadElt, bool_t AllowDummyElt)
{
    ebml_element *Result = NULL;
    if (EBML_ElementIsFiniteSize(p)) {
        assert(TestReadElt == NULL);
        assert(p->ElementPosition < p->SizePosition);
        Stream_Seek(Input, EBML_ElementPositionEnd(p), SEEK_SET);
    } else {
        // read elements until an upper element is found
        int bUpperElement = 0; // trick to call FindNextID correctly
        Result = EBML_FindNextElement(Input, Context, &bUpperElement, AllowDummyElt);
        if (Result != NULL)
            Stream_Seek(Input, EBML_ElementPositionData(Result), SEEK_SET);
    }
    return Result;
}